

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O1

void QCoreApplication::removeLibraryPath(QString *path)

{
  QStringList *this;
  bool bVar1;
  Type *pTVar2;
  difference_type dVar3;
  QRecursiveMutex *this_00;
  CaseSensitivity in_R8D;
  long in_FS_OFFSET;
  QDeadlineTimer timeout;
  QStringView str;
  QArrayDataPointer<QString> QStack_68;
  QDir local_50;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((path->d).size == 0) goto LAB_0027bcc6;
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QDir::QDir(&local_50,path);
  QDir::canonicalPath(&local_48,&local_50);
  QDir::~QDir(&local_50);
  if ((QStringList *)local_48.d.size != (QStringList *)0x0) {
    if ((char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>::guard._q_value.
              super___atomic_base<signed_char>._M_i < -1) {
      pTVar2 = (Type *)0x0;
    }
    else {
      pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_>::
               instance();
    }
    this_00 = &pTVar2->libraryPathMutex;
    timeout.t2 = 0;
    timeout.type = 1;
    timeout.t1 = 0x7fffffffffffffff;
    QRecursiveMutex::tryLock(this_00,timeout);
    this = &pTVar2->manual_libpaths;
    if ((pTVar2->manual_libpaths).d.ptr == (QString *)0x0) {
      libraryPathsLocked();
      QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_68);
      str.m_data = (storage_type_conflict *)0x1;
      str.m_size = (qsizetype)local_48.d.ptr;
      bVar1 = QtPrivate::QStringList_contains
                        ((QtPrivate *)&pTVar2->app_libpaths,(QStringList *)local_48.d.size,str,
                         in_R8D);
      if (bVar1) {
        QArrayDataPointer<QString>::operator=(&this->d,&(pTVar2->app_libpaths).d);
        QtPrivate::sequential_erase_with_copy<QList<QString>,QString>(this,&local_48);
        if (bVar1) goto LAB_0027bc39;
      }
    }
    else {
      dVar3 = QtPrivate::sequential_erase_with_copy<QList<QString>,QString>(this,&local_48);
      if (dVar3 != 0) {
LAB_0027bc39:
        QRecursiveMutex::unlock(this_00);
        QFactoryLoader::refreshAll((QFactoryLoader *)this_00);
        goto LAB_0027bca3;
      }
    }
    QRecursiveMutex::unlock(this_00);
  }
LAB_0027bca3:
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0027bcc6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCoreApplication::removeLibraryPath(const QString &path)
{
    if (path.isEmpty())
        return;

    QString canonicalPath = QDir(path).canonicalPath();
    if (canonicalPath.isEmpty())
        return;

    QCoreApplicationData *d = coreappdata;
    QMutexLocker locker(&d->libraryPathMutex);

    QStringList *libpaths = &d->manual_libpaths;
    if (d->libPathsManuallySet()) {
        if (libpaths->removeAll(canonicalPath) == 0)
            return;
    } else {
        // make sure that library paths is initialized
        libraryPathsLocked();
        QStringList *app_libpaths = &d->app_libpaths;
        if (!app_libpaths->contains(canonicalPath))
            return;

        *libpaths = *app_libpaths;
        libpaths->removeAll(canonicalPath);
        Q_ASSERT(d->libPathsManuallySet());
    }

    locker.unlock();
    QFactoryLoader::refreshAll();
}